

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O2

int_t cLUMemInit(fact_t fact,void *work,int_t lwork,int m,int n,int_t annz,int panel_size,
                float fill_ratio,SuperMatrix *L,SuperMatrix *U,GlobalLU_t *Glu,int **iwork,
                singlecomplex **dwork)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ExpHeader *pEVar6;
  void *pvVar7;
  void *pvVar8;
  int_t *addr;
  int_t *addr_00;
  int_t *piVar9;
  int iVar10;
  int n_00;
  int_t *piVar11;
  undefined4 in_register_00000084;
  int *piVar12;
  int *piVar13;
  int_t *piVar14;
  uint local_180;
  uint local_17c;
  int *local_178;
  int local_16c;
  undefined8 local_168;
  ulong local_160;
  int_t *local_158;
  int_t *local_150;
  int_t *local_148;
  int *local_140;
  char msg [256];
  
  local_168 = CONCAT44(in_register_00000084,n);
  local_160 = CONCAT44(local_160._4_4_,annz);
  Glu->n = n;
  Glu->num_expansions = 0;
  local_178._0_4_ = fill_ratio;
  pEVar6 = (ExpHeader *)superlu_malloc(0x60);
  Glu->expanders = pEVar6;
  if (pEVar6 == (ExpHeader *)0x0) {
    sprintf(msg,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for expanders",0xd4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cmemory.c");
    superlu_abort_and_exit(msg);
  }
  local_16c = m;
  if (fact == SamePattern_SameRowPerm) {
    pvVar7 = L->Store;
    pvVar8 = U->Store;
    piVar12 = *(int **)((long)pvVar7 + 0x30);
    piVar13 = *(int **)((long)pvVar7 + 0x28);
    piVar11 = *(int_t **)((long)pvVar7 + 0x10);
    piVar14 = *(int_t **)((long)pvVar7 + 0x20);
    piVar9 = *(int_t **)((long)pvVar8 + 0x18);
    iVar10 = Glu->nzlmax;
    uVar4 = Glu->nzumax;
    uVar5 = Glu->nzlumax;
    local_160 = (ulong)uVar5;
    if (lwork == 0) {
      Glu->MemModel = SYSTEM;
    }
    else {
      if (lwork == -1) {
        return (int)local_168 * 0x15 + (iVar10 + (panel_size * 2 + 7) * m) * 4 + uVar4 * 0xc +
               (panel_size + 1) * m * 8 + uVar5 * 8 + 0x14;
      }
      Glu->MemModel = USER;
      iVar3 = lwork / 4 << 2;
      (Glu->stack).top2 = iVar3;
      (Glu->stack).size = iVar3;
    }
    local_178 = (int *)CONCAT44(local_178._4_4_,uVar4);
    addr = *(int_t **)((long)pvVar7 + 0x18);
    pEVar6 = Glu->expanders;
    pEVar6[2].mem = addr;
    pvVar7 = *(void **)((long)pvVar7 + 8);
    pEVar6->mem = pvVar7;
    addr_00 = *(int_t **)((long)pvVar8 + 0x10);
    pEVar6[3].mem = addr_00;
    pvVar8 = *(void **)((long)pvVar8 + 8);
    pEVar6[1].mem = pvVar8;
    pEVar6[2].size = iVar10;
    pEVar6->size = uVar5;
    pEVar6[3].size = uVar4;
    pEVar6[1].size = uVar4;
  }
  else {
    local_180 = (uint)((float)(int)local_160 * local_178._0_4_);
    if (lwork == -1) {
      return (panel_size * 0x10 + 0x24) * m + (int)local_168 * 0x15 + local_180 * 0x18 + 0x14;
    }
    local_17c = local_180;
    msg._0_4_ = local_180;
    cSetupSpace(work,lwork,Glu);
    if (Glu->MemModel == SYSTEM) {
      iVar10 = (int)local_168 + 1;
      local_178 = int32Malloc(iVar10);
      local_140 = int32Malloc(iVar10);
      local_148 = intMalloc(iVar10);
      local_150 = intMalloc(iVar10);
      local_158 = intMalloc(iVar10);
    }
    else {
      iVar10 = (int)local_168 * 4 + 4;
      local_178 = (int *)cuser_malloc(iVar10,0,Glu);
      local_140 = (int *)cuser_malloc(iVar10,0,Glu);
      local_148 = (int_t *)cuser_malloc(iVar10,0,Glu);
      local_150 = (int_t *)cuser_malloc(iVar10,0,Glu);
      local_158 = (int_t *)cuser_malloc(iVar10,0,Glu);
    }
    pvVar7 = cexpand((int_t *)&local_180,LUSUP,0,0,Glu);
    pvVar8 = cexpand((int_t *)&local_17c,UCOL,0,0,Glu);
    addr = (int_t *)cexpand((int_t *)msg,LSUB,0,0,Glu);
    while (addr_00 = (int_t *)cexpand((int_t *)&local_17c,USUB,0,1,Glu), piVar9 = local_158,
          piVar11 = local_150, piVar12 = local_178, piVar13 = local_140, piVar14 = local_148,
          iVar10 = msg._0_4_, uVar4 = local_17c, uVar5 = local_180,
          (addr_00 == (int_t *)0x0 || addr == (int_t *)0x0) ||
          (pvVar8 == (void *)0x0 || pvVar7 == (void *)0x0)) {
      if (Glu->MemModel == SYSTEM) {
        superlu_free(pvVar7);
        superlu_free(pvVar8);
        superlu_free(addr);
        superlu_free(addr_00);
      }
      else {
        iVar10 = local_17c * 0xc + local_180 * 8 + msg._0_4_ * 4;
        uVar1 = (Glu->stack).used;
        uVar2 = (Glu->stack).top1;
        (Glu->stack).used = uVar1 - iVar10;
        (Glu->stack).top1 = uVar2 - iVar10;
      }
      uVar4 = (int)local_180 / 2;
      uVar5 = (int)local_17c / 2;
      iVar10 = (int)msg._0_4_ / 2;
      local_180 = uVar4;
      local_17c = uVar5;
      msg._0_4_ = iVar10;
      if ((int)uVar4 < (int)local_160) {
        puts("Not enough memory to perform factorization.");
        return (int)local_168 * 0x29 + uVar4 * 8 + uVar5 * 0xc + iVar10 * 4;
      }
      pvVar7 = cexpand((int_t *)&local_180,LUSUP,0,0,Glu);
      pvVar8 = cexpand((int_t *)&local_17c,UCOL,0,0,Glu);
      addr = (int_t *)cexpand((int_t *)msg,LSUB,0,0,Glu);
    }
  }
  Glu->xsup = piVar12;
  Glu->supno = piVar13;
  Glu->lsub = addr;
  Glu->xlsub = piVar14;
  Glu->lusup = pvVar7;
  Glu->xlusup = piVar11;
  Glu->ucol = pvVar8;
  Glu->usub = addr_00;
  Glu->xusub = piVar9;
  Glu->nzlmax = iVar10;
  Glu->nzumax = uVar4;
  Glu->nzlumax = uVar5;
  n_00 = (int)local_168;
  iVar3 = cLUWorkInit(local_16c,n_00,panel_size,iwork,dwork,Glu);
  if (iVar3 == 0) {
    Glu->num_expansions = Glu->num_expansions + 1;
    iVar3 = 0;
  }
  else {
    iVar3 = n_00 * 0x29 + iVar10 * 4 + uVar4 * 0xc + uVar5 * 8 + iVar3;
  }
  return iVar3;
}

Assistant:

int_t
cLUMemInit(fact_t fact, void *work, int_t lwork, int m, int n, int_t annz,
	  int panel_size, float fill_ratio, SuperMatrix *L, SuperMatrix *U,
          GlobalLU_t *Glu, int **iwork, singlecomplex **dwork)
{
    int      info, iword, dword;
    SCformat *Lstore;
    NCformat *Ustore;
    int      *xsup, *supno;
    int_t    *lsub, *xlsub;
    singlecomplex   *lusup;
    int_t    *xlusup;
    singlecomplex   *ucol;
    int_t    *usub, *xusub;
    int_t    nzlmax, nzumax, nzlumax;
    
    iword     = sizeof(int);
    dword     = sizeof(singlecomplex);
    Glu->n    = n;
    Glu->num_expansions = 0;

    Glu->expanders = (ExpHeader *) SUPERLU_MALLOC( NO_MEMTYPE *
                                                     sizeof(ExpHeader) );
    if ( !Glu->expanders ) ABORT("SUPERLU_MALLOC fails for expanders");
    
    if ( fact != SamePattern_SameRowPerm ) {
	/* Guess for L\U factors */
	nzumax = nzlumax = nzlmax = fill_ratio * annz;
	//nzlmax = SUPERLU_MAX(1, fill_ratio/4.) * annz;

	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else {
	    cSetupSpace(work, lwork, Glu);
	}
	
#if ( PRNTlevel >= 1 )
	printf("cLUMemInit() called: fill_ratio %.0f, nzlmax %lld, nzumax %lld\n", 
	       fill_ratio, (long long) nzlmax, (long long) nzumax);
	fflush(stdout);
#endif	
	
	/* Integer pointers for L\U factors */
	if ( Glu->MemModel == SYSTEM ) {
	    xsup   = int32Malloc(n+1);
	    supno  = int32Malloc(n+1);
	    xlsub  = intMalloc(n+1);
	    xlusup = intMalloc(n+1);
	    xusub  = intMalloc(n+1);
	} else {
	    xsup   = (int *)cuser_malloc((n+1) * iword, HEAD, Glu);
	    supno  = (int *)cuser_malloc((n+1) * iword, HEAD, Glu);
	    xlsub  = cuser_malloc((n+1) * iword, HEAD, Glu);
	    xlusup = cuser_malloc((n+1) * iword, HEAD, Glu);
	    xusub  = cuser_malloc((n+1) * iword, HEAD, Glu);
	}

	lusup = (singlecomplex *) cexpand( &nzlumax, LUSUP, 0, 0, Glu );
	ucol  = (singlecomplex *) cexpand( &nzumax, UCOL, 0, 0, Glu );
	lsub  = (int_t *) cexpand( &nzlmax, LSUB, 0, 0, Glu );
	usub  = (int_t *) cexpand( &nzumax, USUB, 0, 1, Glu );

	while ( !lusup || !ucol || !lsub || !usub ) {
	    if ( Glu->MemModel == SYSTEM ) {
		SUPERLU_FREE(lusup); 
		SUPERLU_FREE(ucol); 
		SUPERLU_FREE(lsub); 
		SUPERLU_FREE(usub);
	    } else {
		cuser_free((nzlumax+nzumax)*dword+(nzlmax+nzumax)*iword,
                            HEAD, Glu);
	    }
	    nzlumax /= 2;
	    nzumax /= 2;
	    nzlmax /= 2;
	    if ( nzlumax < annz ) {
		printf("Not enough memory to perform factorization.\n");
		return (cmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
	    }
#if ( PRNTlevel >= 1)
	    printf("cLUMemInit() reduce size: nzlmax %ld, nzumax %ld\n", 
		   (long) nzlmax, (long) nzumax);
	    fflush(stdout);
#endif
	    lusup = (singlecomplex *) cexpand( &nzlumax, LUSUP, 0, 0, Glu );
	    ucol  = (singlecomplex *) cexpand( &nzumax, UCOL, 0, 0, Glu );
	    lsub  = (int_t *) cexpand( &nzlmax, LSUB, 0, 0, Glu );
	    usub  = (int_t *) cexpand( &nzumax, USUB, 0, 1, Glu );
	}
	
    } else {
	/* fact == SamePattern_SameRowPerm */
	Lstore   = L->Store;
	Ustore   = U->Store;
	xsup     = Lstore->sup_to_col;
	supno    = Lstore->col_to_sup;
	xlsub    = Lstore->rowind_colptr;
	xlusup   = Lstore->nzval_colptr;
	xusub    = Ustore->colptr;
	nzlmax   = Glu->nzlmax;    /* max from previous factorization */
	nzumax   = Glu->nzumax;
	nzlumax  = Glu->nzlumax;
	
	if ( lwork == -1 ) {
	    return ( GluIntArray(n) * iword + TempSpace(m, panel_size)
		    + (nzlmax+nzumax)*iword + (nzlumax+nzumax)*dword + n );
        } else if ( lwork == 0 ) {
	    Glu->MemModel = SYSTEM;
	} else {
	    Glu->MemModel = USER;
	    Glu->stack.top2 = (lwork/4)*4; /* must be word-addressable */
	    Glu->stack.size = Glu->stack.top2;
	}
	
	lsub  = Glu->expanders[LSUB].mem  = Lstore->rowind;
	lusup = Glu->expanders[LUSUP].mem = Lstore->nzval;
	usub  = Glu->expanders[USUB].mem  = Ustore->rowind;
	ucol  = Glu->expanders[UCOL].mem  = Ustore->nzval;;
	Glu->expanders[LSUB].size         = nzlmax;
	Glu->expanders[LUSUP].size        = nzlumax;
	Glu->expanders[USUB].size         = nzumax;
	Glu->expanders[UCOL].size         = nzumax;	
    }

    Glu->xsup    = xsup;
    Glu->supno   = supno;
    Glu->lsub    = lsub;
    Glu->xlsub   = xlsub;
    Glu->lusup   = (void *) lusup;
    Glu->xlusup  = xlusup;
    Glu->ucol    = (void *) ucol;
    Glu->usub    = usub;
    Glu->xusub   = xusub;
    Glu->nzlmax  = nzlmax;
    Glu->nzumax  = nzumax;
    Glu->nzlumax = nzlumax;
    
    info = cLUWorkInit(m, n, panel_size, iwork, dwork, Glu);
    if ( info )
	return ( info + cmemory_usage(nzlmax, nzumax, nzlumax, n) + n);
    
    ++Glu->num_expansions;
    return 0;
    
}